

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O0

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::name_abi_cxx11_(TemplateDictionary *this)

{
  char *pcVar1;
  size_t sVar2;
  long in_RSI;
  allocator local_19 [9];
  TemplateDictionary *this_local;
  
  this_local = this;
  pcVar1 = TemplateString::data((TemplateString *)(in_RSI + 0x18));
  sVar2 = TemplateString::size((TemplateString *)(in_RSI + 0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,sVar2,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return this;
}

Assistant:

std::string name() const {
    return std::string(name_.data(), name_.size());
  }